

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::BlobShape::InternalSerializeWithCachedSizesToArray
          (BlobShape *this,bool deterministic,uint8 *target)

{
  int iVar1;
  uint8 *puVar2;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_30;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  BlobShape *this_local;
  
  iVar1 = dim_size(this);
  puStack_30 = target;
  if (0 < iVar1) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteTagToArray
                       (1,WIRETYPE_LENGTH_DELIMITED,target);
    puVar2 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       (this->_dim_cached_byte_size_,puVar2);
    puStack_30 = google::protobuf::internal::WireFormatLite::WriteInt64NoTagToArray
                           (&this->dim_,puVar2);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = BlobShape::unknown_fields(this);
    puStack_30 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_30);
  }
  return puStack_30;
}

Assistant:

::google::protobuf::uint8* BlobShape::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.BlobShape)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 dim = 1 [packed = true];
  if (this->dim_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      1,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _dim_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt64NoTagToArray(this->dim_, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.BlobShape)
  return target;
}